

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O1

void __thiscall icu_63::Transliterator::Transliterator(Transliterator *this,Transliterator *other)

{
  UnicodeString *this_00;
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  UChar local_1a;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Transliterator_004793b0;
  this_00 = &this->ID;
  icu_63::UnicodeString::UnicodeString(this_00,&other->ID);
  this->filter = (UnicodeFilter *)0x0;
  this->maximumContextLength = other->maximumContextLength;
  local_1a = L'\0';
  icu_63::UnicodeString::doAppend(this_00,&local_1a,0,1);
  uVar1 = (this->ID).fUnion.fStackFields.fLengthAndFlags;
  if ((short)uVar1 < 0) {
    iVar2 = (this->ID).fUnion.fFields.fLength;
  }
  else {
    iVar2 = (int)(short)uVar1 >> 5;
  }
  iVar3 = iVar2 + -1;
  if (iVar3 == 0 && ((int)(short)uVar1 & 1U) != 0) {
    icu_63::UnicodeString::unBogus(this_00);
  }
  else if (iVar2 != 0) {
    if (iVar2 < 0x401) {
      (this->ID).fUnion.fStackFields.fLengthAndFlags = (short)iVar3 * 0x20 | uVar1 & 0x1f;
    }
    else {
      (this->ID).fUnion.fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
      (this->ID).fUnion.fFields.fLength = iVar3;
    }
  }
  if (other->filter != (UnicodeFilter *)0x0) {
    iVar2 = (*(other->filter->super_UnicodeFunctor).super_UObject._vptr_UObject[3])();
    this->filter = (UnicodeFilter *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

Transliterator::Transliterator(const Transliterator& other) :
    UObject(other), ID(other.ID), filter(0),
    maximumContextLength(other.maximumContextLength)
{
    // NUL-terminate the ID string, which is a non-aliased copy.
    ID.append((UChar)0);
    ID.truncate(ID.length()-1);

    if (other.filter != 0) {
        // We own the filter, so we must have our own copy
        filter = (UnicodeFilter*) other.filter->clone();
    }
}